

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O2

OperatorKey * Kernel::OperatorType::setupKey(uint arity,TermList *sorts)

{
  uint i;
  Vector<Kernel::TermList> *pVVar1;
  ulong uVar2;
  TermList TVar3;
  uint i_1;
  
  pVVar1 = Lib::Vector<Kernel::TermList>::allocate((ulong)(arity + 1));
  if (sorts == (TermList *)0x0) {
    for (uVar2 = 0; arity != uVar2; uVar2 = uVar2 + 1) {
      TVar3 = AtomicSort::defaultSort();
      *(uint64_t *)(pVVar1 + uVar2 * 8 + 8) = TVar3._content;
    }
  }
  else {
    for (uVar2 = 0; arity != uVar2; uVar2 = uVar2 + 1) {
      *(uint64_t *)(pVVar1 + uVar2 * 8 + 8) = sorts[uVar2]._content;
    }
  }
  return pVVar1;
}

Assistant:

OperatorType::OperatorKey* OperatorType::setupKey(unsigned arity, const TermList* sorts)
{
  OperatorKey* key = OperatorKey::allocate(arity+1);

  if (!sorts) {
    // initialise all argument types to the default type
    for (unsigned i=0; i < arity; i++) {
      (*key)[i] = AtomicSort::defaultSort();
    }
  } else {
    // initialise all the argument types to those taken from sorts
    for (unsigned i = 0; i < arity; i++) {
      ASS(sorts[i].isVar() || sorts[i].term()->isSort());
      (*key)[i] = sorts[i];
    }
  }
  return key;
}